

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void llvm::
     SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>_>,_false>
     ::destroy_range(InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
                     *S,InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
                        *E)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  if (E != S) {
    do {
      puVar1 = *(undefined1 **)
                &E[-1].
                 super_MessageBase<Fixpp::Field,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>
                 .unparsed;
      if (&E[-1].
           super_MessageBase<Fixpp::Field,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>
           .field_0x78 != puVar1) {
        free(puVar1);
      }
      puVar2 = *(undefined1 **)
                &E[-1].
                 super_MessageBase<Fixpp::Field,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>
                 .values.base.
                 super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<456U,_Fixpp::Type::String>_>,_false>
      ;
      puVar1 = &E[-1].
                super_MessageBase<Fixpp::Field,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>
                .values.base.
                super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<456U,_Fixpp::Type::String>_>,_false>
                .field_0x10;
      if (puVar1 != puVar2) {
        operator_delete(puVar2,*(long *)puVar1 + 1);
      }
      puVar2 = *(undefined1 **)
                &E[-1].
                 super_MessageBase<Fixpp::Field,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>
                 .values.base.
                 super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_false>
      ;
      puVar1 = &E[-1].
                super_MessageBase<Fixpp::Field,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>
                .values.base.
                super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_false>
                .field_0x10;
      if (puVar1 != puVar2) {
        operator_delete(puVar2,*(long *)puVar1 + 1);
      }
      E = E + -1;
    } while (E != S);
  }
  return;
}

Assistant:

static void destroy_range(T *S, T *E) {
    while (S != E) {
      --E;
      E->~T();
    }
  }